

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-feat.c
# Opt level: O3

void project_feature_handler_COLD(project_feature_handler_context_t *context)

{
  chunk_conflict *c;
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t *pwVar3;
  wchar_t wVar4;
  loc grid;
  
  _Var1 = square_isview(cave,context->grid);
  if ((_Var1) && (player->timed[2] == 0)) {
    context->obvious = true;
  }
  wVar4 = context->dam;
  uVar2 = Rand_div(900);
  if (uVar2 + L'ĭ' < wVar4) {
    _Var1 = square_isfiery(cave,context->grid);
    if (_Var1) {
      _Var1 = square_isoccupied(cave,context->grid);
      square_unmark(cave,context->grid);
      uVar2 = Rand_div(2);
      if (uVar2 == 0) {
        grid = context->grid;
        wVar4 = FEAT_FLOOR;
      }
      else {
        uVar2 = Rand_div(2);
        grid = context->grid;
        if (uVar2 == 0 && !_Var1) {
          pwVar3 = &FEAT_RUBBLE;
        }
        else {
          pwVar3 = &FEAT_PASS_RUBBLE;
        }
        wVar4 = *pwVar3;
      }
      square_set_feat(cave,grid,wVar4);
      c = cave;
      if (cave->depth == 0) {
        _Var1 = is_daytime();
        expose_to_sun((chunk *)c,context->grid,_Var1);
        return;
      }
    }
  }
  return;
}

Assistant:

static void project_feature_handler_COLD(project_feature_handler_context_t *context)
{
	/* Grid is in line of sight and player is not blind */
	if (square_isview(cave, context->grid) && !player->timed[TMD_BLIND]) {
		/* Observe */
		context->obvious = true;
	}

	/* Sufficiently intense cold can solidify lava. */
	if ((context->dam > randint1(900) + 300) &&
		square_isfiery(cave, context->grid)) {
		bool occupied = square_isoccupied(cave, context->grid);

		square_unmark(cave, context->grid);
		if (one_in_(2)) {
			square_set_feat(cave, context->grid, FEAT_FLOOR);
		} else if (one_in_(2) && !occupied) {
			square_set_feat(cave, context->grid, FEAT_RUBBLE);
		} else {
			square_set_feat(cave, context->grid, FEAT_PASS_RUBBLE);
		}
		if (cave->depth == 0)
			expose_to_sun(cave, context->grid, is_daytime());
	}
}